

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O1

string * __thiscall
ut11::Operands::EqualTo<char[10]>::GetErrorMessage<std::__cxx11::string>
          (string *__return_storage_ptr__,EqualTo<char[10]> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  char (*__s) [10];
  pointer pcVar1;
  size_t sVar2;
  ostream *poVar3;
  stringstream errorMessage;
  char *local_358;
  long local_350;
  char local_348 [16];
  ostream *local_338;
  long local_330;
  ostream local_328 [112];
  ios_base local_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Expected ",9);
  __s = this->m_expected;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_338);
  sVar2 = strlen(*__s);
  std::__ostream_insert<char,std::char_traits<char>>(local_328,*__s,sVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_338);
  std::ios_base::~ios_base(local_2b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_358,local_350);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," but was ",9);
  pcVar1 = (actual->_M_dataplus)._M_p;
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,pcVar1,pcVar1 + actual->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_338,local_330);
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}